

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicState1::Run(BasicState1 *this)

{
  CallLogWrapper *this_00;
  ulong uVar1;
  uint index;
  ulong uVar2;
  char *pcVar3;
  GLint p;
  GLint64 p64;
  uint local_34;
  long local_30;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,1000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,1000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x82da,(GLint *)&local_34);
  uVar1 = (ulong)local_34;
  if ((int)local_34 < 0x10) {
    pcVar3 = "GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n";
  }
  else {
    glu::CallLogWrapper::glGetIntegerv(this_00,0x82d9,(GLint *)&local_34);
    uVar1 = (ulong)local_34;
    if ((int)local_34 < 0x7ff) {
      pcVar3 = "GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n";
    }
    else {
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
      index = 0;
      do {
        glu::CallLogWrapper::glGetVertexAttribiv(this_00,index,0x82d4,(GLint *)&local_34);
        if (index != local_34) {
          pcVar3 = "GL_VERTEX_ATTRIB_BINDING(%d) is %d should be %d.\n";
          uVar1 = (ulong)index;
LAB_00a07aec:
          anon_unknown_0::Output(pcVar3,(ulong)index,(ulong)local_34,uVar1);
          return -1;
        }
        glu::CallLogWrapper::glGetVertexAttribiv(this_00,index,0x82d5,(GLint *)&local_34);
        if (local_34 != 0) {
          pcVar3 = "GL_VERTEX_ATTRIB_RELATIVE_OFFSET(%d) is %d should be %d.\n";
          uVar1 = 0;
          goto LAB_00a07aec;
        }
        glu::CallLogWrapper::glGetInteger64i_v(this_00,0x82d7,index,&local_30);
        if (local_30 != 0) {
          pcVar3 = "GL_VERTEX_BINDING_OFFSET(%d) should be 0.\n";
          uVar1 = (ulong)index;
          goto LAB_00a07659;
        }
        glu::CallLogWrapper::glGetIntegeri_v(this_00,0x82d8,index,(GLint *)&local_34);
        uVar1 = (ulong)local_34;
        if (local_34 != 0x10) {
          pcVar3 = "GL_VERTEX_BINDING_STRIDE(%d) is %d should be 16.\n";
          uVar2 = (ulong)index;
          goto LAB_00a07b0f;
        }
        index = index + 1;
      } while (index != 0x10);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1400,'\x01',0x10);
      glu::CallLogWrapper::glGetVertexAttribiv(this_00,0,0x8623,(GLint *)&local_34);
      uVar1 = (ulong)local_34;
      if (local_34 == 2) {
        glu::CallLogWrapper::glGetVertexAttribiv(this_00,0,0x8625,(GLint *)&local_34);
        uVar1 = (ulong)local_34;
        if (local_34 == 0x1400) {
          glu::CallLogWrapper::glGetVertexAttribiv(this_00,0,0x886a,(GLint *)&local_34);
          uVar1 = (ulong)local_34;
          if (local_34 == 1) {
            glu::CallLogWrapper::glGetVertexAttribiv(this_00,0,0x82d5,(GLint *)&local_34);
            uVar1 = (ulong)local_34;
            if (local_34 == 0x10) {
              glu::CallLogWrapper::glVertexAttribIFormat(this_00,2,3,0x1404,0x200);
              glu::CallLogWrapper::glGetVertexAttribiv(this_00,2,0x8623,(GLint *)&local_34);
              uVar1 = (ulong)local_34;
              if (local_34 == 3) {
                glu::CallLogWrapper::glGetVertexAttribiv(this_00,2,0x8625,(GLint *)&local_34);
                uVar1 = (ulong)local_34;
                if (local_34 == 0x1404) {
                  glu::CallLogWrapper::glGetVertexAttribiv(this_00,2,0x82d5,(GLint *)&local_34);
                  uVar1 = (ulong)local_34;
                  if (local_34 == 0x200) {
                    glu::CallLogWrapper::glGetVertexAttribiv(this_00,2,0x88fd,(GLint *)&local_34);
                    uVar1 = (ulong)local_34;
                    if (local_34 == 1) {
                      glu::CallLogWrapper::glVertexAttribLFormat(this_00,0xf,1,0x140a,0x400);
                      glu::CallLogWrapper::glGetVertexAttribiv
                                (this_00,0xf,0x8623,(GLint *)&local_34);
                      uVar1 = (ulong)local_34;
                      if (local_34 == 1) {
                        glu::CallLogWrapper::glGetVertexAttribiv
                                  (this_00,0xf,0x8625,(GLint *)&local_34);
                        uVar1 = (ulong)local_34;
                        if (local_34 == 0x140a) {
                          glu::CallLogWrapper::glGetVertexAttribiv
                                    (this_00,0xf,0x82d5,(GLint *)&local_34);
                          uVar1 = (ulong)local_34;
                          if (local_34 == 0x400) {
                            glu::CallLogWrapper::glGetVertexAttribiv
                                      (this_00,0xf,0x874e,(GLint *)&local_34);
                            uVar1 = (ulong)local_34;
                            if (local_34 == 1) {
                              glu::CallLogWrapper::glVertexAttribBinding(this_00,0,7);
                              glu::CallLogWrapper::glGetVertexAttribiv
                                        (this_00,0,0x82d4,(GLint *)&local_34);
                              if (local_34 != 7) {
                                return -1;
                              }
                              glu::CallLogWrapper::glVertexAttribBinding(this_00,3,7);
                              glu::CallLogWrapper::glGetVertexAttribiv
                                        (this_00,3,0x82d4,(GLint *)&local_34);
                              if (local_34 != 7) {
                                return -1;
                              }
                              glu::CallLogWrapper::glVertexAttribBinding(this_00,9,0);
                              glu::CallLogWrapper::glGetVertexAttribiv
                                        (this_00,9,0x82d4,(GLint *)&local_34);
                              if (local_34 != 0) {
                                return -1;
                              }
                              glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,1);
                              glu::CallLogWrapper::glGetVertexAttribiv
                                        (this_00,0xf,0x82d4,(GLint *)&local_34);
                              if (local_34 != 1) {
                                return -1;
                              }
                              glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,0xf);
                              glu::CallLogWrapper::glGetVertexAttribiv
                                        (this_00,0xf,0x82d4,(GLint *)&local_34);
                              if (local_34 != 0xf) {
                                return -1;
                              }
                              glu::CallLogWrapper::glBindVertexBuffer
                                        (this_00,0,this->m_vbo[0],0x400,0x80);
                              glu::CallLogWrapper::glGetInteger64i_v(this_00,0x82d7,0,&local_30);
                              if (local_30 != 0x400) {
                                pcVar3 = "GL_VERTEX_BINDING_OFFSET(0) should be 1024.\n";
LAB_00a07bb2:
                                anon_unknown_0::Output(pcVar3);
                                return -1;
                              }
                              glu::CallLogWrapper::glGetIntegeri_v
                                        (this_00,0x82d8,0,(GLint *)&local_34);
                              uVar1 = (ulong)local_34;
                              if (local_34 == 0x80) {
                                glu::CallLogWrapper::glGetVertexAttribiv
                                          (this_00,0,0x8624,(GLint *)&local_34);
                                uVar1 = (ulong)local_34;
                                if (local_34 == 0) {
                                  glu::CallLogWrapper::glGetVertexAttribiv
                                            (this_00,0,0x889f,(GLint *)&local_34);
                                  uVar2 = (ulong)local_34;
                                  if (local_34 != 0) {
                                    pcVar3 = 
                                    "GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(0) is %d should be %d.\n"
                                    ;
                                    uVar1 = 0;
LAB_00a07b0f:
                                    anon_unknown_0::Output(pcVar3,uVar2,uVar1);
                                    return -1;
                                  }
                                  glu::CallLogWrapper::glBindVertexBuffer
                                            (this_00,0xf,this->m_vbo[1],0x10,0x20);
                                  glu::CallLogWrapper::glGetInteger64i_v
                                            (this_00,0x82d7,0xf,&local_30);
                                  if (local_30 != 0x10) {
                                    pcVar3 = "GL_VERTEX_BINDING_OFFSET(15) should be 16.\n";
                                    goto LAB_00a07bb2;
                                  }
                                  glu::CallLogWrapper::glGetIntegeri_v
                                            (this_00,0x82d8,0xf,(GLint *)&local_34);
                                  uVar1 = (ulong)local_34;
                                  if (local_34 == 0x20) {
                                    glu::CallLogWrapper::glGetVertexAttribiv
                                              (this_00,0xf,0x8624,(GLint *)&local_34);
                                    uVar1 = (ulong)local_34;
                                    if (local_34 == 0) {
                                      glu::CallLogWrapper::glGetVertexAttribiv
                                                (this_00,0xf,0x889f,(GLint *)&local_34);
                                      uVar2 = (ulong)local_34;
                                      uVar1 = (ulong)this->m_vbo[1];
                                      if (local_34 == this->m_vbo[1]) {
                                        return 0;
                                      }
                                      pcVar3 = 
                                      "GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(15) is %d should be %d.\n"
                                      ;
                                      goto LAB_00a07b0f;
                                    }
                                    pcVar3 = 
                                    "GL_VERTEX_ATTRIB_ARRAY_STRIDE(15) is %d should be 0.\n";
                                  }
                                  else {
                                    pcVar3 = "GL_VERTEX_BINDING_STRIDE(15) is %d should be 32.\n";
                                  }
                                }
                                else {
                                  pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_STRIDE(0) is %d should be 0.\n";
                                }
                              }
                              else {
                                pcVar3 = "GL_VERTEX_BINDING_STRIDE(0) is %d should be 128.\n";
                              }
                            }
                            else {
                              pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_LONG(15) is %d should be GL_TRUE.\n";
                            }
                          }
                          else {
                            pcVar3 = "GL_VERTEX_ATTRIB_RELATIVE_OFFSET(15) is %d should be 1024.\n";
                          }
                        }
                        else {
                          pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_TYPE(15) is %d should be GL_DOUBLE.\n";
                        }
                      }
                      else {
                        pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_SIZE(15) is %d should be 1.\n";
                      }
                    }
                    else {
                      pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_INTEGER(2) is %d should be GL_TRUE.\n";
                    }
                  }
                  else {
                    pcVar3 = "GL_VERTEX_ATTRIB_RELATIVE_OFFSET(2) is %d should be 512.\n";
                  }
                }
                else {
                  pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_TYPE(2) is %d should be GL_INT.\n";
                }
              }
              else {
                pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_SIZE(2) is %d should be 3.\n";
              }
            }
            else {
              pcVar3 = "GL_VERTEX_ATTRIB_RELATIVE_OFFSET(0) is %d should be 16.\n";
            }
          }
          else {
            pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_NORMALIZED(0) is %d should be GL_TRUE.\n";
          }
        }
        else {
          pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_TYPE(0) is %d should be GL_BYTE.\n";
        }
      }
      else {
        pcVar3 = "GL_VERTEX_ATTRIB_ARRAY_SIZE(0) is %d should be 2.\n";
      }
    }
  }
LAB_00a07659:
  anon_unknown_0::Output(pcVar3,uVar1);
  return -1;
}

Assistant:

virtual long Run()
	{
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 1000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		if (p < 16)
		{
			Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n", p);
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p < 2047)
		{
			Output("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n", p);
			return ERROR;
		}

		glBindVertexArray(m_vao);
		// check default state
		for (GLuint i = 0; i < 16; ++i)
		{
			glGetVertexAttribiv(i, GL_VERTEX_ATTRIB_BINDING, &p);
			if (static_cast<GLint>(i) != p)
			{
				Output("GL_VERTEX_ATTRIB_BINDING(%d) is %d should be %d.\n", i, p, i);
				return ERROR;
			}
			glGetVertexAttribiv(i, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
			if (p != 0)
			{
				Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(%d) is %d should be %d.\n", i, p, 0);
				return ERROR;
			}
			GLint64 p64;
			glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, i, &p64);
			if (p64 != 0)
			{
				Output("GL_VERTEX_BINDING_OFFSET(%d) should be 0.\n", i);
				return ERROR;
			}
			glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, i, &p);
			if (p != 16)
			{
				Output("GL_VERTEX_BINDING_STRIDE(%d) is %d should be 16.\n", i, p);
				return ERROR;
			}
		}
		glVertexAttribFormat(0, 2, GL_BYTE, GL_TRUE, 16);
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_SIZE, &p);
		if (p != 2)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_SIZE(0) is %d should be 2.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_TYPE, &p);
		if (p != GL_BYTE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_TYPE(0) is %d should be GL_BYTE.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, &p);
		if (p != GL_TRUE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_NORMALIZED(0) is %d should be GL_TRUE.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p != 16)
		{
			Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(0) is %d should be 16.\n", p);
			return ERROR;
		}

		glVertexAttribIFormat(2, 3, GL_INT, 512);
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_ARRAY_SIZE, &p);
		if (p != 3)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_SIZE(2) is %d should be 3.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_ARRAY_TYPE, &p);
		if (p != GL_INT)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_TYPE(2) is %d should be GL_INT.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p != 512)
		{
			Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(2) is %d should be 512.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(2, GL_VERTEX_ATTRIB_ARRAY_INTEGER, &p);
		if (p != GL_TRUE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_INTEGER(2) is %d should be GL_TRUE.\n", p);
			return ERROR;
		}

		glVertexAttribLFormat(15, 1, GL_DOUBLE, 1024);
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_SIZE, &p);
		if (p != 1)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_SIZE(15) is %d should be 1.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_TYPE, &p);
		if (p != GL_DOUBLE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_TYPE(15) is %d should be GL_DOUBLE.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p != 1024)
		{
			Output("GL_VERTEX_ATTRIB_RELATIVE_OFFSET(15) is %d should be 1024.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_LONG, &p);
		if (p != GL_TRUE)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_LONG(15) is %d should be GL_TRUE.\n", p);
			return ERROR;
		}

		glVertexAttribBinding(0, 7);
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 7)
			return ERROR;
		glVertexAttribBinding(3, 7);
		glGetVertexAttribiv(3, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 7)
			return ERROR;
		glVertexAttribBinding(9, 0);
		glGetVertexAttribiv(9, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 0)
			return ERROR;
		glVertexAttribBinding(15, 1);
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 1)
			return ERROR;
		glVertexAttribBinding(15, 15);
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_BINDING, &p);
		if (p != 15)
			return ERROR;

		glBindVertexBuffer(0, m_vbo[0], 1024, 128);
		GLint64 p64;
		glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, 0, &p64);
		if (p64 != 1024)
		{
			Output("GL_VERTEX_BINDING_OFFSET(0) should be 1024.\n");
			return ERROR;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, 0, &p);
		if (p != 128)
		{
			Output("GL_VERTEX_BINDING_STRIDE(0) is %d should be 128.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, &p);
		if (p != 0)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_STRIDE(0) is %d should be 0.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(0, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &p);
		if (p != 0)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(0) is %d should be %d.\n", p, 0);
			return ERROR;
		}

		glBindVertexBuffer(15, m_vbo[1], 16, 32);
		glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, 15, &p64);
		if (p64 != 16)
		{
			Output("GL_VERTEX_BINDING_OFFSET(15) should be 16.\n");
			return ERROR;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, 15, &p);
		if (p != 32)
		{
			Output("GL_VERTEX_BINDING_STRIDE(15) is %d should be 32.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_STRIDE, &p);
		if (p != 0)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_STRIDE(15) is %d should be 0.\n", p);
			return ERROR;
		}
		glGetVertexAttribiv(15, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &p);
		if (p != static_cast<GLint>(m_vbo[1]))
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING(15) is %d should be %d.\n", p, m_vbo[1]);
			return ERROR;
		}

		return NO_ERROR;
	}